

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

bool slang::parsing::isSameToken(Token left,Token right)

{
  bool bVar1;
  bool bVar2;
  Trivia *this;
  Trivia *this_00;
  short in_DX;
  short in_DI;
  long lVar3;
  string_view sVar4;
  string_view sVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  Token local_50;
  Token local_40;
  
  if (in_DI == in_DX) {
    sVar4 = Token::rawText(&local_40);
    sVar5 = Token::rawText(&local_50);
    bVar1 = std::operator!=(sVar4,sVar5);
    if (!bVar1) {
      sVar6 = Token::trivia(&local_40);
      this = sVar6.data_;
      sVar7 = Token::trivia(&local_50);
      this_00 = sVar7.data_;
      if (sVar6.size_ == sVar7.size_) {
        lVar3 = sVar6.size_ << 4;
        while( true ) {
          bVar1 = lVar3 == 0;
          if (bVar1) {
            return bVar1;
          }
          if (this->kind != this_00->kind) break;
          sVar4 = Trivia::getRawText(this);
          sVar5 = Trivia::getRawText(this_00);
          bVar2 = std::operator!=(sVar4,sVar5);
          if (bVar2) {
            return bVar1;
          }
          this = this + 1;
          this_00 = this_00 + 1;
          lVar3 = lVar3 + -0x10;
        }
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

static bool isSameToken(Token left, Token right) {
    if (left.kind != right.kind || left.rawText() != right.rawText())
        return false;

    auto lt = left.trivia();
    auto rt = right.trivia();
    if (lt.size() != rt.size())
        return false;

    for (auto lit = lt.begin(), rit = rt.begin(); lit != lt.end(); lit++, rit++) {
        if (lit->kind != rit->kind || lit->getRawText() != rit->getRawText())
            return false;
    }
    return true;
}